

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void cpool_discard_conn(cpool *cpool,Curl_easy *data,connectdata *conn,_Bool aborted)

{
  curl_off_t cVar1;
  connectdata *data_00;
  _Bool _Var2;
  uint uVar3;
  _Bool local_22;
  byte local_21;
  _Bool done;
  connectdata *pcStack_20;
  _Bool aborted_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  cpool *cpool_local;
  
  local_22 = false;
  local_21 = aborted;
  pcStack_20 = conn;
  conn_local = (connectdata *)data;
  data_local = (Curl_easy *)cpool;
  _Var2 = Curl_uint_spbset_empty(&conn->xfers_attached);
  data_00 = conn_local;
  if ((_Var2) || ((local_21 & 1) != 0)) {
    if (pcStack_20->connect_only != '\0') {
      local_21 = 1;
    }
    pcStack_20->bits =
         (ConnectBits)((ulong)pcStack_20->bits & 0xffffffffdfffffff | (ulong)(local_21 & 1) << 0x1d)
    ;
    if ((local_21 & 1) != 0) {
      local_22 = true;
    }
    if ((local_22 & 1U) == 0) {
      Curl_cshutdn_run_once((Curl_easy *)(data_local->msg).extmsg.easy_handle,pcStack_20,&local_22);
    }
    if (((local_22 & 1U) == 0) && ((conn_local->meta_hash).hash_func != (hash_function)0x0)) {
      Curl_cshutdn_add((cshutdn *)((conn_local->meta_hash).hash_func + 0x188),pcStack_20,
                       (size_t)(data_local->msg).list._list);
    }
    else {
      Curl_cshutdn_terminate((Curl_easy *)(data_local->msg).extmsg.easy_handle,pcStack_20,false);
    }
  }
  else if ((((conn_local != (connectdata *)0x0) &&
            ((*(ulong *)&conn_local[1].proxyntlm.target_info_len >> 0x1e & 1) != 0)) &&
           ((*(long *)(conn_local[3].secondary.remote_ip + 0xc) == 0 ||
            (0 < *(int *)(*(long *)(conn_local[3].secondary.remote_ip + 0xc) + 8))))) &&
          (0 < Curl_trc_feat_multi.log_level)) {
    cVar1 = pcStack_20->connection_id;
    uVar3 = Curl_uint_spbset_count(&pcStack_20->xfers_attached);
    Curl_trc_multi((Curl_easy *)data_00,"[CPOOL] not discarding #%ld still in use by %u transfers",
                   cVar1,(ulong)uVar3);
  }
  return;
}

Assistant:

static void cpool_discard_conn(struct cpool *cpool,
                               struct Curl_easy *data,
                               struct connectdata *conn,
                               bool aborted)
{
  bool done = FALSE;

  DEBUGASSERT(data);
  DEBUGASSERT(!data->conn);
  DEBUGASSERT(cpool);
  DEBUGASSERT(!conn->bits.in_cpool);

  /*
   * If this connection is not marked to force-close, leave it open if there
   * are other users of it
   */
  if(CONN_INUSE(conn) && !aborted) {
    CURL_TRC_M(data, "[CPOOL] not discarding #%" FMT_OFF_T
               " still in use by %u transfers", conn->connection_id,
               CONN_ATTACHED(conn));
    return;
  }

  /* treat the connection as aborted in CONNECT_ONLY situations, we do
   * not know what the APP did with it. */
  if(conn->connect_only)
    aborted = TRUE;
  conn->bits.aborted = aborted;

  /* We do not shutdown dead connections. The term 'dead' can be misleading
   * here, as we also mark errored connections/transfers as 'dead'.
   * If we do a shutdown for an aborted transfer, the server might think
   * it was successful otherwise (for example an ftps: upload). This is
   * not what we want. */
  if(aborted)
    done = TRUE;
  if(!done) {
    /* Attempt to shutdown the connection right away. */
    Curl_cshutdn_run_once(cpool->idata, conn, &done);
  }

  if(done || !data->multi)
    Curl_cshutdn_terminate(cpool->idata, conn, FALSE);
  else
    Curl_cshutdn_add(&data->multi->cshutdn, conn, cpool->num_conn);
}